

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O1

nsync_dll_list_ nsync_dll_remove_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  nsync_dll_element_s_ *pnVar1;
  nsync_dll_list_ pnVar2;
  
  pnVar2 = list;
  if (list == e) {
    pnVar2 = (nsync_dll_list_)0x0;
    if (list->prev != list) {
      pnVar2 = list->prev;
    }
  }
  pnVar1 = e->next;
  pnVar1->prev = e->prev;
  e->prev->next = pnVar1;
  e->next = e;
  e->prev = e;
  return pnVar2;
}

Assistant:

nsync_dll_list_ nsync_dll_remove_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (list == e) { /* removing tail of list */
		if (list->prev == list) {
			list = NULL; /* removing only element of list */
		} else {
			list = list->prev;
		}
	}
	e->next->prev = e->prev;
	e->prev->next = e->next;
	e->next = e;
	e->prev = e;
	return (list);
}